

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O2

Error asmjit::v1_14::x86::InstInternal::queryFeatures
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,CpuFeatures *out)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  unsigned_long *puVar10;
  size_t sVar11;
  uint32_t highVecUsed;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  CpuFeatures *pCVar16;
  uint32_t mask;
  uint uVar17;
  long lVar18;
  bool bVar19;
  undefined8 local_68;
  CpuFeatures *local_60;
  size_t local_58;
  uint local_4c;
  ulong local_48;
  InstInfo *local_40;
  BaseInst *local_38;
  
  if (1 < (byte)(arch - k32BitMask)) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86instapi.cpp"
               ,0x5b1,"Environment::isFamilyX86(arch)");
  }
  uVar12 = *(uint *)inst;
  local_48 = (ulong)uVar12;
  if (0x6ba < uVar12) {
    return 0x1a;
  }
  local_4c = *(uint *)(inst + 4);
  local_58 = opCount;
  local_38 = inst;
  local_40 = InstDB::infoById(uVar12);
  bVar1 = local_40->field_0x3;
  local_68 = 0;
  local_60 = out;
  Support::Array<unsigned_long,_4UL>::fill((Array<unsigned_long,_4UL> *)out,&local_68);
  lVar18 = 0;
  do {
    bVar2 = *(byte *)((ulong)bVar1 * 8 + 0x158142 + lVar18);
    if (bVar2 == 0) {
      if (lVar18 == 0) {
        return 0;
      }
      break;
    }
    local_68 = CONCAT44(local_68._4_4_,(uint)(bVar2 >> 6));
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
    *puVar10 = *puVar10 | 1L << (bVar2 & 0x3f);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 6);
  sVar11 = local_58;
  pCVar16 = local_60;
  uVar12 = 0;
  uVar17 = 0;
  for (uVar13 = 0; uVar14 = (ulong)uVar13, uVar14 < local_58; uVar13 = uVar13 + 1) {
    uVar3 = operands[uVar14]._signature._bits;
    if ((uVar3 & 7) == 2) {
      uVar15 = 1 << ((byte)uVar3 >> 3);
      if ((uVar3 & 0xf8) < 9) {
        uVar15 = 0;
      }
      uVar17 = uVar17 | uVar15;
      if (0x100 < (uVar3 & 0x1f00)) {
        uVar17 = uVar17 | 1 << (uVar3 >> 8 & 0x1f);
        lVar18 = 8;
        goto LAB_001424f0;
      }
    }
    else if (((uVar3 & 7) == 1) &&
            (uVar17 = uVar17 | 1 << ((byte)uVar3 >> 3), lVar18 = 4, (uVar3 & 0xf00) == 0x100)) {
LAB_001424f0:
      uVar12 = uVar12 | (*(uint *)((long)operands[uVar14]._data + lVar18 + -8) & 0xfffffff0) == 0x10
      ;
    }
  }
  local_68._0_4_ = 1;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  if (((uint)*puVar10 >> 0xe & 1) == 0) {
    local_68._0_4_ = 1;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    if ((short)*puVar10 < 0) goto LAB_00142540;
  }
  else {
LAB_00142540:
    local_68._0_4_ = 1;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    if ((*puVar10 & 0x200000000000000) == 0) {
      local_68._0_4_ = 1;
      puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
      if ((*puVar10 >> 0x3a & 1) == 0) goto LAB_0014263a;
    }
    if ((uVar17 >> 0xc & 1) == 0) {
      local_68._0_4_ = 1;
      puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
      *(byte *)((long)puVar10 + 7) = *(byte *)((long)puVar10 + 7) & 0xfd;
      local_68._0_4_ = 1;
      puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
      *(byte *)((long)puVar10 + 7) = *(byte *)((long)puVar10 + 7) & 0xfb;
      local_68._0_4_ = 1;
      puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
      *(byte *)((long)puVar10 + 7) = *(byte *)((long)puVar10 + 7) & 0xef;
    }
    else {
      local_68._0_4_ = 1;
      puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
      *(byte *)((long)puVar10 + 1) = *(byte *)((long)puVar10 + 1) & 0xbf;
      local_68._0_4_ = 1;
      puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
      *(byte *)((long)puVar10 + 1) = *(byte *)((long)puVar10 + 1) & 0x7f;
    }
    sVar11 = local_58;
    if ((int)local_48 == 0x21b) {
      if ((local_58 == 0) || (((operands->_signature)._bits & 7) != 2)) {
        local_68._0_4_ = 1;
        puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
        *(byte *)((long)puVar10 + 7) = *(byte *)((long)puVar10 + 7) & 0xef;
      }
      else {
        local_68._0_4_ = 1;
        puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
        *(byte *)((long)puVar10 + 7) = *(byte *)((long)puVar10 + 7) & 0xfb;
      }
    }
  }
LAB_0014263a:
  local_68._0_4_ = 2;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
  if (((uint)*puVar10 >> 8 & 1) != 0) {
    if ((local_4c & 0x1000) == 0 && (uVar17 & 0x4000) == 0) {
      if ((uVar17 >> 0xd & 1) == 0) {
        local_68._0_4_ = 0;
        puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
        *(byte *)((long)puVar10 + 3) = *(byte *)((long)puVar10 + 3) & 0xfe;
        local_68._0_4_ = 0;
        puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
        *(byte *)((long)puVar10 + 3) = *(byte *)((long)puVar10 + 3) & 0xbf;
        local_68._0_4_ = 2;
        puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
        *(byte *)((long)puVar10 + 1) = *(byte *)((long)puVar10 + 1) & 0xfe;
        sVar11 = local_58;
      }
      else {
        local_68._0_4_ = 0;
        puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
        *(byte *)((long)puVar10 + 3) = *(byte *)((long)puVar10 + 3) & 0xfe;
        local_68._0_4_ = 0;
        puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
        *(byte *)((long)puVar10 + 3) = *(byte *)((long)puVar10 + 3) & 0xbf;
        sVar11 = local_58;
      }
    }
    else {
      local_68._0_4_ = 0;
      puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
      sVar11 = local_58;
      *(byte *)((long)puVar10 + 1) = *(byte *)((long)puVar10 + 1) & 0xbf;
      local_68._0_4_ = 1;
      puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
      *(byte *)((long)puVar10 + 3) = *(byte *)((long)puVar10 + 3) & 0xf7;
    }
  }
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
  if (((uint)*puVar10 >> 0xe & 1) != 0) {
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    if ((short)*puVar10 < 0) {
      if (((uint)local_48 & 0x7fe) == 0x36a) {
        if ((sVar11 < 2) || ((operands[1]._signature._bits & 7) != 2)) {
LAB_00142778:
          local_68._0_4_ = 0;
          puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                              ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
          *(byte *)((long)puVar10 + 1) = *(byte *)((long)puVar10 + 1) & 0xbf;
          goto LAB_0014278a;
        }
      }
      else if ((uVar17 & 0x6000) != 0) goto LAB_00142778;
      local_68._0_4_ = 0;
      puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
      *(byte *)((long)puVar10 + 1) = *(byte *)((long)puVar10 + 1) & 0x7f;
    }
  }
LAB_0014278a:
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
  uVar14 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
  uVar4 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  uVar5 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  uVar6 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  uVar7 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  uVar8 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  pCVar16 = local_60;
  if ((*puVar10 & 0x200000000000000) == 0 &&
      ((uVar8 & 0x100000000000000) == 0 &&
      ((uVar7 & 0x8000) == 0 &&
      ((uVar6 & 0x1000000000) == 0 &&
      ((uVar5 & 0x800000000) == 0 && ((uVar4 & 0x400000000) == 0 && (uVar14 & 0x4000) == 0))))))
  goto LAB_00142ba5;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  uVar14 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
  uVar4 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  uVar5 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  uVar6 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  pCVar16 = local_60;
  uVar7 = *puVar10;
  local_68._0_4_ = 0;
  puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      ((Array<unsigned_long,_4UL> *)local_60,(uint *)&local_68);
  if ((*puVar10 & 0x80000000) == 0 &&
      ((uVar7 & 0x4000000) == 0 &&
      ((uVar6 & 0x1000000) == 0 &&
      ((uVar5 & 0x400000) == 0 && ((uVar4 & 0x100000) == 0 && (uVar14 & 0x40000) == 0)))))
  goto LAB_00142ba5;
  uVar12 = uVar17 & 0x24000 | local_4c & 0xfc1000 | (uint)((*(uint *)(local_38 + 8) & 0xf8) == 0x88)
           | uVar12;
  iVar9 = (int)local_48;
  if ((iVar9 - 0x600U < 0x14) && ((0x8f1c7U >> (iVar9 - 0x600U & 0x1f) & 1) != 0)) {
    uVar13 = 0;
    if (local_58 < 2) goto LAB_00142a39;
    bVar19 = (operands[1]._signature._bits & 7) == 2;
LAB_00142a36:
    uVar13 = (uint)bVar19;
LAB_00142a39:
    uVar12 = uVar12 | uVar13;
  }
  else {
    if ((iVar9 - 0x466U < 0xc) && ((0xc03U >> (iVar9 - 0x466U & 0x1f) & 1) != 0)) {
LAB_00142a30:
      bVar19 = local_58 == 2;
      goto LAB_00142a36;
    }
    if ((iVar9 - 0x4ffU < 6) && ((0x33U >> (iVar9 - 0x4ffU & 0x1f) & 1) != 0)) {
      uVar13 = 0;
      if (1 < local_58) {
        bVar19 = (operands[1]._signature._bits & 0xf07) == 1;
        goto LAB_00142a36;
      }
      goto LAB_00142a39;
    }
    if (iVar9 - 0x559U < 4) goto LAB_00142a30;
    if ((iVar9 - 0x380U < 0x29) && ((0x10000000005U >> ((ulong)(iVar9 - 0x380U) & 0x3f) & 1) != 0))
    {
      uVar13 = 0;
      if (1 < local_58) {
        bVar19 = ((operands->_signature)._bits & 0xff000fff) == 0x20000169;
        goto LAB_00142a36;
      }
      goto LAB_00142a39;
    }
    if (iVar9 == 0x547) {
      uVar13 = 0;
      if (2 < local_58) {
LAB_00142c3f:
        uVar13 = (uint)((operands[2]._signature._bits & 7) != 4);
      }
      goto LAB_00142a39;
    }
    if (iVar9 == 0x549) {
      uVar13 = 0;
      if ((2 < local_58) && (uVar13 = 1, (operands[1]._signature._bits & 7) != 2))
      goto LAB_00142c3f;
      goto LAB_00142a39;
    }
  }
  if (((local_4c & 0xc00) == 0 &&
       (InstDB::_commonInfoTable[(ulong)(*(uint *)local_40 >> 0xb & 0x1ff8) + 3] & 1) != 0) ||
     (uVar12 != 0)) {
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 1) = *(byte *)((long)puVar10 + 1) & 0xbf;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 4) = *(byte *)((long)puVar10 + 4) & 0xfb;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 4) = *(byte *)((long)puVar10 + 4) & 0xf7;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 4) = *(byte *)((long)puVar10 + 4) & 0xef;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 1) = *(byte *)((long)puVar10 + 1) & 0x7f;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 7) = *(byte *)((long)puVar10 + 7) & 0xfe;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 7) = *(byte *)((long)puVar10 + 7) & 0xfd;
  }
  else {
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 2) = *(byte *)((long)puVar10 + 2) & 0xfb;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 2) = *(byte *)((long)puVar10 + 2) & 0xef;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 2) = *(byte *)((long)puVar10 + 2) & 0xbf;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 3) = *(byte *)((long)puVar10 + 3) & 0xfe;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 3) = *(byte *)((long)puVar10 + 3) & 0xfb;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 3) = *(byte *)((long)puVar10 + 3) & 0xbf;
    local_68._0_4_ = 0;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 3) = *(byte *)((long)puVar10 + 3) & 0x7f;
  }
LAB_00142ba5:
  if ((uVar17 >> 0xe & 1) != 0) {
    local_68 = (ulong)local_68._4_4_ << 0x20;
    puVar10 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)pCVar16,(uint *)&local_68);
    *(byte *)((long)puVar10 + 3) = *(byte *)((long)puVar10 + 3) & 0xbf;
  }
  return 0;
}

Assistant:

Error queryFeatures(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, CpuFeatures* out) noexcept {
  typedef CpuFeatures::X86 Ext;

  // Only called when `arch` matches X86 family.
  DebugUtils::unused(arch);
  ASMJIT_ASSERT(Environment::isFamilyX86(arch));

  // Get the instruction data.
  InstId instId = inst.id();
  InstOptions options = inst.options();

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(instId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
  const InstDB::AdditionalInfo& additionalInfo = InstDB::_additionalInfoTable[instInfo._additionalInfoIndex];

  const uint8_t* fData = additionalInfo.featuresBegin();
  const uint8_t* fEnd = additionalInfo.featuresEnd();

  // Copy all features to `out`.
  out->reset();
  do {
    uint32_t feature = fData[0];
    if (!feature)
      break;
    out->add(feature);
  } while (++fData != fEnd);

  // Since AsmJit aggregates instructions that share the same name we have to
  // deal with some special cases and also with MMX/SSE and AVX/AVX2 overlaps.
  if (fData != additionalInfo.featuresBegin()) {
    RegAnalysis regAnalysis = InstInternal_regAnalysis(operands, opCount);

    // Handle MMX vs SSE overlap.
    if (out->has(Ext::kMMX) || out->has(Ext::kMMX2)) {
      // Only instructions defined by SSE and SSE2 overlap. Instructions introduced by newer instruction sets like
      // SSE3+ don't state MMX as they require SSE3+.
      if (out->has(Ext::kSSE) || out->has(Ext::kSSE2)) {
        if (!regAnalysis.hasRegType(RegType::kX86_Xmm)) {
          // The instruction doesn't use XMM register(s), thus it's MMX/MMX2 only.
          out->remove(Ext::kSSE);
          out->remove(Ext::kSSE2);
          out->remove(Ext::kSSE4_1);
        }
        else {
          out->remove(Ext::kMMX);
          out->remove(Ext::kMMX2);
        }

        // Special case: PEXTRW instruction is MMX/SSE2 instruction. However, MMX/SSE version cannot access memory
        // (only register to register extract) so when SSE4.1 introduced the whole family of PEXTR/PINSR instructions
        // they also introduced PEXTRW with a new opcode 0x15 that can extract directly to memory. This instruction
        // is, of course, not compatible with MMX/SSE2 and would #UD if SSE4.1 is not supported.
        if (instId == Inst::kIdPextrw) {
          if (opCount >= 1 && operands[0].isMem())
            out->remove(Ext::kSSE2);
          else
            out->remove(Ext::kSSE4_1);
        }
      }
    }

    // Handle PCLMULQDQ vs VPCLMULQDQ.
    if (out->has(Ext::kVPCLMULQDQ)) {
      if (regAnalysis.hasRegType(RegType::kX86_Zmm) || Support::test(options, InstOptions::kX86_Evex)) {
        // AVX512_F & VPCLMULQDQ.
        out->remove(Ext::kAVX, Ext::kPCLMULQDQ);
      }
      else if (regAnalysis.hasRegType(RegType::kX86_Ymm)) {
        out->remove(Ext::kAVX512_F, Ext::kAVX512_VL);
      }
      else {
        // AVX & PCLMULQDQ.
        out->remove(Ext::kAVX512_F, Ext::kAVX512_VL, Ext::kVPCLMULQDQ);
      }
    }

    // Handle AVX vs AVX2 overlap.
    if (out->has(Ext::kAVX) && out->has(Ext::kAVX2)) {
      bool isAVX2 = true;
      // Special case: VBROADCASTSS and VBROADCASTSD were introduced in AVX, but only version that uses memory as a
      // source operand. AVX2 then added support for register source operand.
      if (instId == Inst::kIdVbroadcastss || instId == Inst::kIdVbroadcastsd) {
        if (opCount > 1 && operands[1].isMem())
          isAVX2 = false;
      }
      else {
        // AVX instruction set doesn't support integer operations on YMM registers as these were later introcuced by
        // AVX2. In our case we have to check if YMM register(s) are in use and if that is the case this is an AVX2
        // instruction.
        if (!(regAnalysis.regTypeMask & Support::bitMask(RegType::kX86_Ymm, RegType::kX86_Zmm)))
          isAVX2 = false;
      }

      if (isAVX2)
        out->remove(Ext::kAVX);
      else
        out->remove(Ext::kAVX2);
    }

    // Handle AVX vs AVX512 overlap.
    //
    // In general, non-AVX encoding is preferred, however, AVX encoded instructions that were initially provided
    // as AVX-512 instructions must naturally prefer AVX-512 encoding, as that was the first one provided.
    if (out->hasAny(Ext::kAVX,
                    Ext::kAVX_IFMA,
                    Ext::kAVX_NE_CONVERT,
                    Ext::kAVX_VNNI,
                    Ext::kAVX2,
                    Ext::kF16C,
                    Ext::kFMA)
        &&
        out->hasAny(Ext::kAVX512_BF16,
                    Ext::kAVX512_BW,
                    Ext::kAVX512_DQ,
                    Ext::kAVX512_F,
                    Ext::kAVX512_IFMA,
                    Ext::kAVX512_VNNI)) {

      uint32_t useEvex = InstInternal_usesAvx512(options, inst.extraReg(), regAnalysis) | regAnalysis.highVecUsed;
      switch (instId) {
        // Special case: VPBROADCAST[B|D|Q|W] only supports r32/r64 with EVEX prefix.
        case Inst::kIdVpbroadcastb:
        case Inst::kIdVpbroadcastd:
        case Inst::kIdVpbroadcastq:
        case Inst::kIdVpbroadcastw:
          useEvex |= uint32_t(opCount >= 2 && x86::Reg::isGp(operands[1]));
          break;

        case Inst::kIdVcvtpd2dq:
        case Inst::kIdVcvtpd2ps:
        case Inst::kIdVcvttpd2dq:
          useEvex |= uint32_t(opCount >= 2 && Reg::isYmm(operands[0]));
          break;

        case Inst::kIdVgatherdpd:
        case Inst::kIdVgatherdps:
        case Inst::kIdVgatherqpd:
        case Inst::kIdVgatherqps:
        case Inst::kIdVpgatherdd:
        case Inst::kIdVpgatherdq:
        case Inst::kIdVpgatherqd:
        case Inst::kIdVpgatherqq:
          useEvex |= uint32_t(opCount == 2);
          break;

        // Special case: These instructions only allow `reg, reg. imm` combination in AVX|AVX2 mode, then
        // AVX-512 introduced `reg, reg/mem, imm` combination that uses EVEX prefix. This means that if
        // the second operand is memory then this is AVX-512_BW instruction and not AVX/AVX2 instruction.
        case Inst::kIdVpslldq:
        case Inst::kIdVpslld:
        case Inst::kIdVpsllq:
        case Inst::kIdVpsllw:
        case Inst::kIdVpsrad:
        case Inst::kIdVpsraq:
        case Inst::kIdVpsraw:
        case Inst::kIdVpsrld:
        case Inst::kIdVpsrldq:
        case Inst::kIdVpsrlq:
        case Inst::kIdVpsrlw:
          useEvex |= uint32_t(opCount >= 2 && operands[1].isMem());
          break;

        // Special case: VPERMPD - AVX2 vs AVX512-F case.
        case Inst::kIdVpermpd:
          useEvex |= uint32_t(opCount >= 3 && !operands[2].isImm());
          break;

        // Special case: VPERMQ - AVX2 vs AVX512-F case.
        case Inst::kIdVpermq:
          useEvex |= uint32_t(opCount >= 3 && (operands[1].isMem() || !operands[2].isImm()));
          break;
      }

      if (instInfo.commonInfo().preferEvex() && !Support::test(options, InstOptions::kX86_Vex | InstOptions::kX86_Vex3))
        useEvex = 1;

      if (useEvex) {
        out->remove(Ext::kAVX,
                    Ext::kAVX_IFMA,
                    Ext::kAVX_NE_CONVERT,
                    Ext::kAVX_VNNI,
                    Ext::kAVX2,
                    Ext::kF16C,
                    Ext::kFMA);
      }
      else {
        out->remove(Ext::kAVX512_BF16,
                    Ext::kAVX512_BW,
                    Ext::kAVX512_DQ,
                    Ext::kAVX512_F,
                    Ext::kAVX512_IFMA,
                    Ext::kAVX512_VL,
                    Ext::kAVX512_VNNI);
      }
    }

    // Clear AVX512_VL if ZMM register is used.
    if (regAnalysis.hasRegType(RegType::kX86_Zmm))
      out->remove(Ext::kAVX512_VL);
  }

  return kErrorOk;
}